

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

SimpleTypeHandler<3UL> * __thiscall
Js::SimpleTypeHandler<3UL>::ConvertToNonSharedSimpleType
          (SimpleTypeHandler<3UL> *this,DynamicObject *instance)

{
  code *pcVar1;
  bool bVar2;
  PropertyTypes values;
  Recycler *alloc;
  SimpleTypeHandler<3UL> *this_00;
  undefined4 *puVar3;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  local_50 = (undefined1  [8])&SimpleTypeHandler<3ul>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_a021a98;
  data.filename._0_4_ = 0x6e;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                      super_JavascriptLibraryBase).scriptContext.ptr)->recycler,
                     (TrackAllocData *)local_50);
  this_00 = (SimpleTypeHandler<3UL> *)new<Memory::Recycler>(0x50,alloc,0x387914);
  SimpleTypeHandler(this_00,this,true);
  DynamicTypeHandler::SetFlags
            ((DynamicTypeHandler *)this_00,(this->super_DynamicTypeHandler).flags & 0x22);
  if (((this_00->super_DynamicTypeHandler).propertyTypes & 0x40) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x75,"(newTypeHandler->GetIsInlineSlotCapacityLocked())",
                                "newTypeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  values = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)this_00,0xb0,values);
  DynamicTypeHandler::SetInstanceTypeHandler((DynamicTypeHandler *)this_00,instance,true);
  return this_00;
}

Assistant:

SimpleTypeHandler<size> * SimpleTypeHandler<size>::ConvertToNonSharedSimpleType(DynamicObject* instance)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();


        CompileAssert(_countof(descriptors) == size);

        SimpleTypeHandler * newTypeHandler = RecyclerNew(recycler, SimpleTypeHandler, this, true /*unused*/);

        // Consider: Add support for fixed fields to SimpleTypeHandler when
        // non-shared.  Here we could set the instance as the singleton instance on the newly
        // created handler.

        newTypeHandler->SetFlags(IsPrototypeFlag | HasKnownSlot0Flag, this->GetFlags());
        Assert(newTypeHandler->GetIsInlineSlotCapacityLocked());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance);

        return newTypeHandler;
    }